

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMAddress.cpp
# Opt level: O0

void __thiscall HiROMAddress::fromImageAddress(HiROMAddress *this,ImageAddress *imageAdress)

{
  uint uVar1;
  uint32_t *puVar2;
  char local_19;
  uint16_t bankAddress;
  uint8_t bank;
  ImageAddress *imageAdress_local;
  HiROMAddress *this_local;
  
  puVar2 = ImageAddress::operator_cast_to_unsigned_int_(imageAdress);
  if (*puVar2 < 0x400000) {
    puVar2 = ImageAddress::operator_cast_to_unsigned_int_(imageAdress);
    local_19 = (char)(*puVar2 >> 0x10);
    puVar2 = ImageAddress::operator_cast_to_unsigned_int_(imageAdress);
    uVar1 = *puVar2;
    puVar2 = ImageAddress::operator_cast_to_unsigned_int_(imageAdress);
    if (0x3dffff < *puVar2) {
      local_19 = local_19 + -0x80;
    }
    (this->super_ROMAddress).m_Address = (uint)CONCAT12(local_19,(short)((ulong)uVar1 % 0xffff));
    return;
  }
  __assert_fail("imageAdress < 0x400000",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/ROMAddress.cpp"
                ,0xa4,"virtual void HiROMAddress::fromImageAddress(ImageAddress)");
}

Assistant:

void HiROMAddress::fromImageAddress(ImageAddress imageAdress) {
    assert(imageAdress < 0x400000);

    uint8_t bank = imageAdress / 0x10000;
    uint16_t bankAddress = imageAdress % 0xFFFF;
    if(imageAdress > 0x3DFFFF) {
        //we have to use the second mirror because otherwise we would refer to system RAM
        bank += 0x80;
    }
    m_Address = (bank << 16) | bankAddress;
}